

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Local.cpp
# Opt level: O2

Point Local::moves_fast_match
                (set<Point,_std::less<Point>,_std::allocator<Point>_> *options,char input,
                bool *reselect,bool get)

{
  _Rep_type *p_Var1;
  char cVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  undefined7 in_register_00000031;
  int iVar8;
  int iVar9;
  ulong uVar10;
  undefined1 local_b8 [24];
  _Base_ptr local_a0;
  set<Point,_std::less<Point>,_std::allocator<Point>_> *local_98;
  set<Point,_std::less<Point>,_std::allocator<Point>_> matches;
  set<Point,_std::less<Point>,_std::allocator<Point>_> final_matches;
  
  *reselect = false;
  if ((options->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 1) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             (char)(options->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left
                                   [1]._M_color + 0x61);
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,(short)*(undefined2 *)
                                       ((long)&(options->_M_t)._M_impl.super__Rb_tree_header.
                                               _M_header._M_left[1]._M_color + 2) + 1);
    std::endl<char,std::char_traits<char>>(poVar5);
    p_Var7 = (options->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left + 1;
  }
  else {
    uVar10 = CONCAT71(in_register_00000031,input) & 0xffffffff;
    matches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &matches._M_t._M_impl.super__Rb_tree_header._M_header;
    matches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    matches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    matches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    final_matches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &final_matches._M_t._M_impl.super__Rb_tree_header._M_header;
    final_matches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    final_matches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    final_matches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var1 = &options->_M_t;
    local_b8._8_8_ = reselect;
    local_98 = options;
    matches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         matches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    final_matches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         final_matches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      do {
        if ((get & 1U) != 0) {
          cVar2 = getch();
          uVar3 = tolower((int)cVar2);
          uVar10 = (ulong)uVar3;
        }
        cVar2 = (char)uVar10;
        iVar8 = (int)cVar2;
        iVar4 = isspace(iVar8);
        get = true;
      } while (iVar4 != 0);
      if (cVar2 == 'u') {
        poVar5 = std::operator<<((ostream *)&std::cout,'u');
        std::endl<char,std::char_traits<char>>(poVar5);
        *(bool *)(_Rb_tree_color *)local_b8._8_8_ = true;
        Point::Point((Point *)local_b8,-1,-1);
        goto LAB_0010f0bd;
      }
      local_b8._4_4_ = (undefined4)uVar10;
      local_b8._16_8_ = &matches;
      local_a0 = &matches._M_t._M_impl.super__Rb_tree_header._M_header;
      for (p_Var6 = (options->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &(p_Var1->_M_impl).super__Rb_tree_header;
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        if (((iVar8 - 0x30U < 10) &&
            (iVar8 + -0x31 == (int)(short)*(undefined2 *)((long)&p_Var6[1]._M_color + 2))) ||
           ((iVar4 = isalpha(iVar8), iVar4 != 0 && (iVar8 + -0x61 == (int)(short)p_Var6[1]._M_color)
            ))) {
          std::insert_iterator<std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>::
          operator=((insert_iterator<std::set<Point,_std::less<Point>,_std::allocator<Point>_>_> *)
                    (local_b8 + 0x10),(value_type *)(p_Var6 + 1));
        }
      }
      uVar10 = (ulong)(uint)local_b8._4_4_;
      get = true;
      options = local_98;
    } while (matches._M_t._M_impl.super__Rb_tree_header._M_node_count == 0);
    iVar4 = isalpha(iVar8);
    std::operator<<((ostream *)&std::cout,cVar2);
    if (matches._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
      iVar4 = isalpha(iVar8);
      cVar2 = '1';
      if (iVar4 == 0) {
        cVar2 = 'a';
      }
      poVar5 = std::operator<<((ostream *)&std::cout,
                               cVar2 + *(char *)((long)&matches._M_t._M_impl.super__Rb_tree_header.
                                                        _M_header._M_left[1]._M_color +
                                                (ulong)(iVar4 != 0) * 2));
      std::endl<char,std::char_traits<char>>(poVar5);
      p_Var7 = matches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    else {
      do {
        std::_Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>
        ::clear((_Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>
                 *)&final_matches);
        do {
          cVar2 = getch();
          uVar3 = tolower((int)cVar2);
          iVar9 = (int)(char)uVar3;
          iVar8 = isspace(iVar9);
        } while (iVar8 != 0);
        if ((uVar3 & 0xff) == 0x75) {
          poVar5 = std::operator<<((ostream *)&std::cout,'u');
          std::endl<char,std::char_traits<char>>(poVar5);
          *(bool *)(_Rb_tree_color *)local_b8._8_8_ = true;
          Point::Point((Point *)local_b8,-1,-1);
          goto LAB_0010f0bd;
        }
        local_a0 = &final_matches._M_t._M_impl.super__Rb_tree_header._M_header;
        local_b8._4_4_ = iVar9 - 0x61;
        local_b8._16_8_ = (_Base_ptr)&final_matches;
        for (p_Var7 = matches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var7 != &matches._M_t._M_impl.super__Rb_tree_header;
            p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
          if (((iVar9 - 0x30U < 10 && iVar4 != 0) &&
              (iVar9 + -0x31 == (int)(short)*(undefined2 *)((long)&p_Var7[1]._M_color + 2))) ||
             ((iVar8 = isalpha(iVar9), iVar8 != 0 &&
              ((iVar4 == 0 && (local_b8._4_4_ == (int)(short)p_Var7[1]._M_color)))))) {
            std::insert_iterator<std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>::
            operator=((insert_iterator<std::set<Point,_std::less<Point>,_std::allocator<Point>_>_> *
                      )(local_b8 + 0x10),(value_type *)(p_Var7 + 1));
          }
        }
      } while (final_matches._M_t._M_impl.super__Rb_tree_header._M_node_count != 1);
      poVar5 = std::operator<<((ostream *)&std::cout,(char)uVar3);
      std::endl<char,std::char_traits<char>>(poVar5);
      p_Var7 = final_matches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    local_b8._0_4_ = p_Var7[1]._M_color;
LAB_0010f0bd:
    std::_Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>::
    ~_Rb_tree(&final_matches._M_t);
    std::_Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>::
    ~_Rb_tree(&matches._M_t);
    p_Var7 = (_Base_ptr)local_b8;
  }
  return (Point)p_Var7->_M_color;
}

Assistant:

Point Local::moves_fast_match(const set<Point> &options, char input, bool &reselect, bool get) {
    reselect = false;
#if AUTOFILL
    // Only one option.
    if (options.size() == 1) {
        cout << (char) (options.begin()->get_x() + 'a') << options.begin()->get_y() + 1 << endl;
        return *options.begin();
    }
#endif // AUTOFILL

    set<Point> matches, final_matches;

    // First reduction.
    do {
        do {
            if (get) {
                input = (char) tolower(getch());
            }
            get = true;
        } while (isspace(input));

        if (input == reselect_action) {
            cout << input << endl;
            reselect = true;
            return {-1, -1};
        }

        copy_if(options.begin(), options.end(), inserter(matches, matches.end()),
                [&, input](const auto &point) {
                    return ((isdigit(input) && (point.get_y() == input - '0' - 1)) ||
                            (isalpha(input) && (point.get_x() == input - 'a')));
                });
    } while (matches.empty());

    const bool first_char = isalpha(input);
    cout << input;

#if AUTOFILL
    // Only one option left.
    if (matches.size() == 1) {
        cout << (char) (isalpha(input) ? (char) matches.begin()->get_y() + '0' + 1 :
                        (char) matches.begin()->get_x() + 'a') << endl;
        return *matches.begin();
    }
#endif // AUTOFILL

    // Second reduction.
    do {
        final_matches.clear();

        do {
            input = (char) tolower(getch());
        } while (isspace(input));

        if (input == reselect_action) {
            cout << input << endl;
            reselect = true;
            return {-1, -1};
        }

        copy_if(matches.begin(), matches.end(), inserter(final_matches, final_matches.end()),
                [&, input](const auto &point) {
                    return ((isdigit(input) && (first_char) && (point.get_y() == input - '0' - 1)) ||
                            (isalpha(input) && (!first_char) && (point.get_x() == input - 'a')));
                });
    } while (final_matches.size() != 1);

    cout << input << endl;

    // Final match.
    return *final_matches.begin();
}